

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O2

void __thiscall NaVector::cov(NaVector *this,NaVector *rVectY,NaVector *rVectMCF)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar10;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  
  iVar2 = (*this->_vptr_NaVector[6])();
  iVar3 = (*rVectY->_vptr_NaVector[6])(rVectY);
  if (iVar3 < iVar2) {
    iVar2 = (*rVectY->_vptr_NaVector[6])(rVectY);
  }
  if (iVar2 != 0) {
    uVar9 = (ulong)(iVar2 * 2 - 1);
    (*rVectMCF->_vptr_NaVector[4])(rVectMCF,uVar9);
    (*this->_vptr_NaVector[0x11])(this);
    (*rVectY->_vptr_NaVector[0x11])(rVectY);
    iVar3 = 1;
    iVar1 = -iVar2;
    iVar6 = iVar2 + -1;
    while( true ) {
      iVar1 = iVar1 + 1;
      iVar7 = (int)uVar9;
      iVar4 = 0;
      if (0 < iVar7) {
        iVar4 = iVar7;
      }
      iVar5 = 0;
      if (0 < iVar3) {
        iVar5 = iVar3;
      }
      if (iVar2 <= iVar1) break;
      dVar10 = 0.0;
      iVar8 = 0;
      if (iVar1 < 0) {
        for (; iVar4 != iVar8; iVar8 = iVar8 + 1) {
          (*rVectY->_vptr_NaVector[10])(rVectY,(long)iVar8 % (long)iVar2 & 0xffffffff);
          (*this->_vptr_NaVector[9])(this,(long)(iVar6 + iVar8) % (long)iVar2 & 0xffffffff);
          dVar10 = dVar10 + (extraout_XMM0_Qa_04 - extraout_XMM0_Qa) *
                            (extraout_XMM0_Qa_03 - extraout_XMM0_Qa_00);
        }
      }
      else {
        for (; iVar5 != iVar8; iVar8 = iVar8 + 1) {
          (*this->_vptr_NaVector[9])(this,(long)iVar8 % (long)iVar2 & 0xffffffff);
          (*rVectY->_vptr_NaVector[10])(rVectY,(long)(iVar1 + iVar8) % (long)iVar2 & 0xffffffff);
          dVar10 = dVar10 + (extraout_XMM0_Qa_02 - extraout_XMM0_Qa_00) *
                            (extraout_XMM0_Qa_01 - extraout_XMM0_Qa);
        }
      }
      iVar4 = (*rVectMCF->_vptr_NaVector[8])(rVectMCF,(ulong)(uint)(iVar2 + -1 + iVar1));
      *(double *)CONCAT44(extraout_var,iVar4) = dVar10 / (double)iVar2;
      iVar3 = iVar3 + 1;
      uVar9 = (ulong)(iVar7 - 1);
      iVar6 = iVar6 + -1;
    }
  }
  return;
}

Assistant:

void
NaVector::cov (const NaVector& rVectY, NaVector& rVectMCF) const
{
    int         k, t, N = (int)dim();

    if(N > (int)rVectY.dim())
        N = rVectY.dim();

    if(0 == N)
        return;

    rVectMCF.new_dim(2*N - 1);

    NaReal      fAvgX = average(), fAvgY = rVectY.average();

    // Compute MCF
    for(k = - N + 1; k < N; ++k){
        NaReal  fSum = 0;

        if(k < 0){
            for(t = 0; t < N - k; ++t){
                fSum += (rVectY(t % N) - fAvgY) * (get((t - k) % N) - fAvgX);
            }
        }else{// k >= 0
            for(t = 0; t < N + k; ++t){
                fSum += (get(t % N) - fAvgX) * (rVectY((t + k) % N) - fAvgY);
            }
        }
        rVectMCF[k + N - 1] = fSum / N;
    }
}